

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

shared_ptr<cxxopts::Value> __thiscall
cxxopts::value<std::__cxx11::string>
          (cxxopts *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cxxopts::Value> sVar1;
  shared_ptr<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  
  local_18 = t;
  t_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  std::make_shared<cxxopts::values::standard_value<std::__cxx11::string>,std::__cxx11::string*>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&local_28);
  std::shared_ptr<cxxopts::Value>::
  shared_ptr<cxxopts::values::standard_value<std::__cxx11::string>,void>
            ((shared_ptr<cxxopts::Value> *)this,&local_28);
  std::
  shared_ptr<cxxopts::values::standard_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~shared_ptr(&local_28);
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<cxxopts::Value>)
         sVar1.super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Value>
  value(T& t)
  {
    return std::make_shared<values::standard_value<T>>(&t);
  }